

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar2;
  pointer pPVar3;
  pointer pcVar4;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_00185b50;
  pTVar2 = this->pimpl;
  if (pTVar2 != (ThreeAxisForceTorqueContactSensorPrivateAttributes *)0x0) {
    pPVar3 = (pTVar2->m_loadCellLocations).
             super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pPVar3 != (pointer)0x0) {
      operator_delete(pPVar3,(long)(pTVar2->m_loadCellLocations).
                                   super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar3
                     );
    }
    pcVar4 = (pTVar2->parent_link_name)._M_dataplus._M_p;
    paVar1 = &(pTVar2->parent_link_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (pTVar2->name)._M_dataplus._M_p;
    paVar1 = &(pTVar2->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pTVar2,0xc0);
  LinkSensor::~LinkSensor(&this->super_LinkSensor);
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor()
{
    delete this->pimpl;
}